

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextHtmlExporter::emitBlockAttributes(QTextHtmlExporter *this,QTextBlock *block)

{
  long lVar1;
  qreal qVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  bool bVar5;
  Alignment align;
  LayoutDirection LVar6;
  int iVar7;
  PageBreakFlags policy;
  QChar QVar8;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_c8;
  QBrush bg;
  QArrayDataPointer<char16_t> local_98;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  QArrayDataPointer<char16_t> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextBlock::blockFormat((QTextBlock *)local_78);
  align = QTextBlockFormat::alignment((QTextBlockFormat *)local_78);
  emitAlignment(this,align);
  LVar6 = QTextBlock::textDirection(block);
  if (LVar6 == RightToLeft) {
    QString::append((QLatin1String *)this);
  }
  QString::append((QLatin1String *)this);
  QTextBlock::begin((iterator *)local_68,block);
  uVar3 = local_68._12_4_;
  uVar4 = local_58.d._0_4_;
  if (local_58.d._0_4_ == local_68._12_4_) {
    QString::append((QLatin1String *)this);
  }
  qVar2 = QTextBlockFormat::topMargin((QTextBlockFormat *)local_78);
  QString::number(qVar2,(char)local_68,0x67);
  qVar2 = QTextBlockFormat::bottomMargin((QTextBlockFormat *)local_78);
  QString::number(qVar2,(char)&local_98,0x67);
  qVar2 = QTextBlockFormat::leftMargin((QTextBlockFormat *)local_78);
  QString::number(qVar2,(char)(QArrayDataPointer<char16_t> *)&bg,0x67);
  qVar2 = QTextBlockFormat::rightMargin((QTextBlockFormat *)local_78);
  QString::number(qVar2,(char)&local_c8,0x67);
  emitMargins(this,(QString *)local_68,(QString *)&local_98,(QString *)&bg,(QString *)&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_c8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&bg);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  QString::append((QLatin1String *)this);
  iVar7 = QTextBlockFormat::indent((QTextBlockFormat *)local_78);
  QString::number((int)(QArrayDataPointer<char16_t> *)local_68,iVar7);
  QString::append((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  QVar8.ucs = (char16_t)this;
  QString::append(QVar8);
  QString::append((QLatin1String *)this);
  qVar2 = QTextBlockFormat::textIndent((QTextBlockFormat *)local_78);
  QString::number(qVar2,(char)(QArrayDataPointer<char16_t> *)local_68,0x67);
  QString::append((QString *)this);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
  QString::append((QLatin1String *)this);
  iVar7 = QTextBlock::userState(block);
  if (iVar7 != -1) {
    QString::append((QLatin1String *)this);
    iVar7 = QTextBlock::userState(block);
    QString::number((int)(QArrayDataPointer<char16_t> *)local_68,iVar7);
    QString::append((QString *)this);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_68);
    QString::append(QVar8);
  }
  iVar7 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)local_78);
  if (iVar7 != 0) {
    qVar2 = QTextBlockFormat::lineHeight((QTextBlockFormat *)local_78);
    QString::number(qVar2,(char)&local_98,0x67);
    local_58.size = local_98.size;
    local_58.ptr = local_98.ptr;
    local_58.d = local_98.d;
    local_68._0_8_ = (QTextFormatPrivate *)0xd;
    local_68._8_8_ = " line-height:";
    local_98.d = (Data *)0x0;
    local_98.ptr = (char16_t *)0x0;
    local_98.size = 0;
    ::operator+=(&this->html,(QStringBuilder<QLatin1String,_QString> *)local_68);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_98);
    iVar7 = QTextBlockFormat::lineHeightType((QTextBlockFormat *)local_78);
    switch(iVar7) {
    case 1:
      break;
    case 2:
      break;
    case 3:
      break;
    case 4:
    }
    QString::append((QLatin1String *)this);
  }
  policy = QTextBlockFormat::pageBreakPolicy((QTextBlockFormat *)local_78);
  emitPageBreakPolicy(this,policy);
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)&local_98);
  if (uVar4 == uVar3) {
    local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat((QTextBlock *)local_68);
    formatDifference((QTextFormat *)&local_c8,&(this->defaultCharFormat).super_QTextFormat);
    QTextFormat::toCharFormat((QTextFormat *)&bg);
    QTextFormat::operator=((QTextFormat *)&local_98,(QTextFormat *)&bg);
    QTextFormat::~QTextFormat((QTextFormat *)&bg);
    QTextFormat::~QTextFormat((QTextFormat *)&local_c8);
    QTextFormat::~QTextFormat((QTextFormat *)local_68);
  }
  QTextFormat::clearProperty((QTextFormat *)&local_98,0x820);
  bVar5 = QTextFormat::hasProperty((QTextFormat *)local_78,0x820);
  if (bVar5) {
    bg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
    super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
    super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl = (DataPtr)&DAT_aaaaaaaaaaaaaaaa;
    QTextFormat::background((QTextFormat *)&bg);
    if (*(int *)((long)bg.d._M_t.super___uniq_ptr_impl<QBrushData,_QBrushDataPointerDeleter>._M_t.
                       super__Tuple_impl<0UL,_QBrushData_*,_QBrushDataPointerDeleter>.
                       super__Head_base<0UL,_QBrushData_*,_false>._M_head_impl + 4) != 0) {
      QTextFormat::property((QVariant *)local_68,(QTextFormat *)local_78,0x820);
      QTextFormat::setProperty((QTextFormat *)&local_98,0x820,(QVariant *)local_68);
      ::QVariant::~QVariant((QVariant *)local_68);
    }
    QBrush::~QBrush(&bg);
  }
  QTextFormat::properties((QTextFormat *)local_68);
  if ((QTextFormatPrivate *)local_68._0_8_ == (QTextFormatPrivate *)0x0) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)local_68);
  }
  else {
    lVar1 = *(long *)(local_68._0_8_ + 0x30);
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
    ::~QExplicitlySharedDataPointerV2
              ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                *)local_68);
    if (lVar1 != 0) {
      emitCharFormatStyle(this,(QTextCharFormat *)&local_98);
    }
  }
  QString::append(QVar8);
  QTextFormat::~QTextFormat((QTextFormat *)&local_98);
  QTextFormat::~QTextFormat((QTextFormat *)local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitBlockAttributes(const QTextBlock &block)
{
    QTextBlockFormat format = block.blockFormat();
    emitAlignment(format.alignment());

    // assume default to not bloat the html too much
    // html += " dir='ltr'"_L1;
    if (block.textDirection() == Qt::RightToLeft)
        html += " dir='rtl'"_L1;

    const auto style = " style=\""_L1;
    html += style;

    const bool emptyBlock = block.begin().atEnd();
    if (emptyBlock) {
        html += "-qt-paragraph-type:empty;"_L1;
    }

    emitMargins(QString::number(format.topMargin()),
                QString::number(format.bottomMargin()),
                QString::number(format.leftMargin()),
                QString::number(format.rightMargin()));

    html += " -qt-block-indent:"_L1;
    html += QString::number(format.indent());
    html += u';';

    html += " text-indent:"_L1;
    html += QString::number(format.textIndent());
    html += "px;"_L1;

    if (block.userState() != -1) {
        html += " -qt-user-state:"_L1;
        html += QString::number(block.userState());
        html += u';';
    }

    if (format.lineHeightType() != QTextBlockFormat::SingleHeight) {
        html += " line-height:"_L1
             + QString::number(format.lineHeight());
        switch (format.lineHeightType()) {
            case QTextBlockFormat::ProportionalHeight:
                html += "%;"_L1;
                break;
            case QTextBlockFormat::FixedHeight:
                html += "; -qt-line-height-type: fixed;"_L1;
                break;
            case QTextBlockFormat::MinimumHeight:
                html += "px;"_L1;
                break;
            case QTextBlockFormat::LineDistanceHeight:
                html += "; -qt-line-height-type: line-distance;"_L1;
                break;
            default:
                html += ";"_L1;
                break; // Should never reach here
        }
    }

    emitPageBreakPolicy(format.pageBreakPolicy());

    QTextCharFormat diff;
    if (emptyBlock) { // only print character properties when we don't expect them to be repeated by actual text in the parag
        const QTextCharFormat blockCharFmt = block.charFormat();
        diff = formatDifference(defaultCharFormat, blockCharFmt).toCharFormat();
    }

    diff.clearProperty(QTextFormat::BackgroundBrush);
    if (format.hasProperty(QTextFormat::BackgroundBrush)) {
        QBrush bg = format.background();
        if (bg.style() != Qt::NoBrush)
            diff.setProperty(QTextFormat::BackgroundBrush, format.property(QTextFormat::BackgroundBrush));
    }

    if (!diff.properties().isEmpty())
        emitCharFormatStyle(diff);

    html += u'"';

}